

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O2

void __thiscall PointToPoint::end(PointToPoint *this,int param_2)

{
  return;
}

Assistant:

inline void kernel(int, int it) override
    {
#ifdef DEBUG_MODE
        fill_sbuf(it);
#endif
        // pointer to the first request.
        auto* rq = reqs;
        for (int i = 0; i < n_partners; i++)
        {
            // As long as there is a waitall between iterations, we do not need
            // to use incremental tags across iterations.
            sendrecv(i, rq, rq + 1, 0);
            rq += 2;
        }

        MPI_Waitall(2 * n_partners, reqs, MPI_STATUSES_IGNORE);
#ifdef DEBUG_MODE
        for (int i = 0; i < n_partners; i++)
            check_rbuf(i, it);
#endif
    }